

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O0

bool __thiscall ON_Plane::CreateFromNormal(ON_Plane *this,ON_3dPoint *P,ON_3dVector *N)

{
  ON_3dVector local_40;
  byte local_21;
  ON_3dVector *pOStack_20;
  bool b;
  ON_3dVector *N_local;
  ON_3dPoint *P_local;
  ON_Plane *this_local;
  
  (this->origin).x = P->x;
  (this->origin).y = P->y;
  (this->origin).z = P->z;
  (this->zaxis).x = N->x;
  (this->zaxis).y = N->y;
  (this->zaxis).z = N->z;
  pOStack_20 = N;
  N_local = (ON_3dVector *)P;
  P_local = &this->origin;
  local_21 = ON_3dVector::Unitize(&this->zaxis);
  ON_3dVector::PerpendicularTo(&this->xaxis,&this->zaxis);
  ON_3dVector::Unitize(&this->xaxis);
  ON_CrossProduct(&local_40,&this->zaxis,&this->xaxis);
  (this->yaxis).x = local_40.x;
  (this->yaxis).y = local_40.y;
  (this->yaxis).z = local_40.z;
  ON_3dVector::Unitize(&this->yaxis);
  UpdateEquation(this);
  return (bool)(local_21 & 1);
}

Assistant:

bool ON_Plane::CreateFromNormal(
    const ON_3dPoint&  P, // point on the plane
    const ON_3dVector& N  // non-zero normal to the plane
    )
{
  origin = P;
  zaxis = N;
  bool b = zaxis.Unitize();
  xaxis.PerpendicularTo( zaxis );
  xaxis.Unitize();
  yaxis = ON_CrossProduct( zaxis, xaxis );
  yaxis.Unitize();

  UpdateEquation();

  return b;
}